

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiz-debug.c
# Opt level: O3

void wiz_cheat_death(void)

{
  player *ppVar1;
  
  ppVar1 = player;
  player->age = 1;
  *(byte *)&ppVar1->noscore = (byte)ppVar1->noscore | 2;
  ppVar1->is_dead = false;
  ppVar1->chp = ppVar1->mhp;
  ppVar1->chp_frac = 0;
  ppVar1->csp = ppVar1->msp;
  ppVar1->csp_frac = 0;
  player_clear_timed(ppVar1,L'\x02',true,false);
  player_clear_timed(player,L'\x04',true,false);
  player_clear_timed(player,L'\a',true,false);
  player_clear_timed(player,L'\x05',true,false);
  player_clear_timed(player,L'\x03',true,false);
  player_clear_timed(player,L'\x06',true,false);
  player_clear_timed(player,L'\t',true,false);
  player_clear_timed(player,L'\b',true,false);
  player_set_timed(player,L'\n',PY_FOOD_FULL + L'\xffffffff',false,false);
  ppVar1 = player;
  if (player->word_recall != 0) {
    msg("A tension leaves the air around you...");
    event_signal(EVENT_MESSAGE_FLUSH);
    ppVar1 = player;
    player->word_recall = 0;
  }
  if (ppVar1->deep_descent != 0) {
    msg("The air around you stops swirling...");
    event_signal(EVENT_MESSAGE_FLUSH);
    ppVar1 = player;
    player->deep_descent = 0;
  }
  my_strcpy(ppVar1->died_from,"Cheating death",0x50);
  dungeon_change_level(player,L'\0');
  return;
}

Assistant:

void wiz_cheat_death(void)
{
	/* Mark social class, reset age, if needed */
	player->age = 1;
	player->noscore |= NOSCORE_WIZARD;

	player->is_dead = false;

	/* Restore hit & spell points */
	player->chp = player->mhp;
	player->chp_frac = 0;
	player->csp = player->msp;
	player->csp_frac = 0;

	/* Healing */
	(void)player_clear_timed(player, TMD_BLIND, true, false);
	(void)player_clear_timed(player, TMD_CONFUSED, true, false);
	(void)player_clear_timed(player, TMD_POISONED, true, false);
	(void)player_clear_timed(player, TMD_AFRAID, true, false);
	(void)player_clear_timed(player, TMD_PARALYZED, true, false);
	(void)player_clear_timed(player, TMD_IMAGE, true, false);
	(void)player_clear_timed(player, TMD_STUN, true, false);
	(void)player_clear_timed(player, TMD_CUT, true, false);

	/* Prevent starvation */
	player_set_timed(player, TMD_FOOD, PY_FOOD_FULL - 1, false, false);

	/* Cancel recall */
	if (player->word_recall)
	{
		/* Message */
		msg("A tension leaves the air around you...");
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Hack -- Prevent recall */
		player->word_recall = 0;
	}

	/* Cancel deep descent */
	if (player->deep_descent)
	{
		/* Message */
		msg("The air around you stops swirling...");
		event_signal(EVENT_MESSAGE_FLUSH);

		/* Hack -- Prevent recall */
		player->deep_descent = 0;
	}

	/* Note cause of death XXX XXX XXX */
	my_strcpy(player->died_from, "Cheating death", sizeof(player->died_from));

	/* Back to the town */
	dungeon_change_level(player, 0);
}